

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O2

void __thiscall QWhatsThisAction::QWhatsThisAction(QWhatsThisAction *this,QObject *parent)

{
  long in_FS_OFFSET;
  QIcon local_50;
  undefined8 local_48;
  Object local_40 [8];
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  tr((QString *)&local_38,"What\'s This?",(char *)0x0,-1);
  QAction::QAction(&this->super_QAction,(QString *)&local_38,parent);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  *(undefined ***)this = &PTR_metaObject_007c6d50;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_38,button_image);
  QIcon::QIcon(&local_50,(QPixmap *)&local_38);
  QAction::setIcon((QIcon *)this);
  QIcon::~QIcon(&local_50);
  QAction::setCheckable(SUB81(this,0));
  local_50.d = (QIconPrivate *)actionTriggered;
  local_48 = 0;
  QObject::connect<void(QAction::*)(bool),void(QWhatsThisAction::*)()>
            (local_40,(offset_in_QAction_to_subr)this,(ContextType *)QAction::triggered,
             (offset_in_QWhatsThisAction_to_subr *)0x0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QKeySequence::QKeySequence
            ((QKeySequence *)&local_50,(QKeyCombination)0x3000030,(QKeyCombination)0x0,
             (QKeyCombination)0x0,(QKeyCombination)0x0);
  QAction::setShortcut((QKeySequence *)this);
  QKeySequence::~QKeySequence((QKeySequence *)&local_50);
  QPixmap::~QPixmap((QPixmap *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisAction::QWhatsThisAction(QObject *parent) : QAction(tr("What's This?"), parent)
{
#ifndef QT_NO_IMAGEFORMAT_XPM
    QPixmap p(button_image);
    setIcon(p);
#endif
    setCheckable(true);
    connect(this, &QWhatsThisAction::triggered, this, &QWhatsThisAction::actionTriggered);
#ifndef QT_NO_SHORTCUT
    setShortcut(Qt::ShiftModifier | Qt::Key_F1);
#endif
}